

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_339b0::CtfBase::reset(CtfBase *this)

{
  long *in_RDI;
  SimpleVehicle *in_stack_00000050;
  CtfBase *in_stack_000000b0;
  
  OpenSteer::SimpleVehicle::reset(in_stack_00000050);
  (**(code **)(*in_RDI + 0xe0))(0x40400000);
  (**(code **)(*in_RDI + 0xf8))(0x40400000);
  (**(code **)(*in_RDI + 0x108))(0x40400000);
  *(undefined1 *)((long)in_RDI + 0xf4) = 0;
  randomizeStartingPositionAndHeading(in_stack_000000b0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  clearTrailHistory((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                    0x12dbb5);
  return;
}

Assistant:

void CtfBase::reset (void)
    {
        SimpleVehicle::reset ();  // reset the vehicle 

        setSpeed (3);             // speed along Forward direction.
        setMaxForce (3.0);        // steering force is clipped to this magnitude
        setMaxSpeed (3.0);        // velocity is clipped to this magnitude

        avoiding = false;         // not actively avoiding

        randomizeStartingPositionAndHeading ();  // new starting position

        clearTrailHistory ();     // prevent long streaks due to teleportation
    }